

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_external_decode_char
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  char *__src;
  cram_block *local_50;
  cram_block *b;
  char *cp;
  int i;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  local_50 = (cram_block *)0x0;
  if (slice->block_by_id == (cram_block **)0x0) {
    cp._4_4_ = 0;
    while ((cp._4_4_ < slice->hdr->num_blocks &&
           (((local_50 = slice->block[cp._4_4_], local_50 == (cram_block *)0x0 ||
             (local_50->content_type != EXTERNAL)) ||
            (local_50->content_id != (c->field_6).huffman.ncodes))))) {
      cp._4_4_ = cp._4_4_ + 1;
    }
    if ((cp._4_4_ == slice->hdr->num_blocks) || (local_50 == (cram_block *)0x0)) {
      return -1;
    }
  }
  else {
    local_50 = slice->block_by_id[(c->field_6).huffman.ncodes];
    if (local_50 == (cram_block *)0x0) {
      if (*out_size == 0) {
        return 0;
      }
      return -1;
    }
  }
  __src = cram_extract_block(local_50,*out_size);
  if (__src == (char *)0x0) {
    slice_local._4_4_ = -1;
  }
  else {
    memcpy(out,__src,(long)*out_size);
    slice_local._4_4_ = 0;
  }
  return slice_local._4_4_;
}

Assistant:

int cram_external_decode_char(cram_slice *slice, cram_codec *c,
			      cram_block *in, char *out,
			      int *out_size) {
    int i;
    char *cp;
    cram_block *b = NULL;

    /* Find the external block */
    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->external.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->external.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    cp = cram_extract_block(b, *out_size);
    if (!cp)
	return -1;

    memcpy(out, cp, *out_size);
    return 0;
}